

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O0

void ihevcd_copy_pps(codec_t *ps_codec,WORD32 pps_id,WORD32 pps_id_ref)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *__src;
  undefined8 *__dest;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  WORD32 ht;
  WORD32 wd;
  WORD32 max_tile_rows;
  WORD32 max_tile_cols;
  tile_t *ps_tile_backup;
  WORD32 scaling_mat_size;
  WORD16 *pi2_scaling_mat_backup;
  pps_t *ps_pps_ref;
  pps_t *ps_pps;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  __src = (undefined8 *)(*(long *)(in_RDI + 0x6a) + (long)in_EDX * 0x50);
  __dest = (undefined8 *)(*(long *)(in_RDI + 0x6a) + (long)in_ESI * 0x50);
  uVar3 = *__dest;
  uVar4 = __dest[1];
  memcpy(__dest,__src,0x50);
  *__dest = uVar3;
  __dest[1] = uVar4;
  memcpy((void *)*__dest,(void *)*__src,0x1fc0);
  memcpy((void *)__dest[1],(void *)__src[1],
         (long)((((iVar1 + 0x3f >> 6) * 0x40 + 0x3f) / 0x40) *
               (((iVar2 + 0x3f >> 6) * 0x40 + 0x3f) / 0x40)) * 6);
  *(undefined1 *)((long)__dest + 0x4b) = 1;
  *(undefined8 **)(in_RDI + 0x7e) = __dest;
  return;
}

Assistant:

void ihevcd_copy_pps(codec_t *ps_codec, WORD32 pps_id, WORD32 pps_id_ref)
{
    pps_t *ps_pps, *ps_pps_ref;
    WORD16 *pi2_scaling_mat_backup;
    WORD32 scaling_mat_size;
    tile_t *ps_tile_backup;
    WORD32 max_tile_cols, max_tile_rows;
    WORD32 wd, ht;
    wd = ALIGN64(ps_codec->i4_wd);
    ht = ALIGN64(ps_codec->i4_ht);

    SCALING_MAT_SIZE(scaling_mat_size);
    max_tile_cols = (wd + MIN_TILE_WD - 1) / MIN_TILE_WD;
    max_tile_rows = (ht + MIN_TILE_HT - 1) / MIN_TILE_HT;

    ps_pps_ref = ps_codec->ps_pps_base + pps_id_ref;
    ps_pps = ps_codec->ps_pps_base + pps_id;

    pi2_scaling_mat_backup = ps_pps->pi2_scaling_mat;
    ps_tile_backup = ps_pps->ps_tile;

    memcpy(ps_pps, ps_pps_ref, sizeof(pps_t));
    ps_pps->pi2_scaling_mat = pi2_scaling_mat_backup;
    ps_pps->ps_tile = ps_tile_backup;
    memcpy(ps_pps->pi2_scaling_mat, ps_pps_ref->pi2_scaling_mat, scaling_mat_size * sizeof(WORD16));
    memcpy(ps_pps->ps_tile, ps_pps_ref->ps_tile, max_tile_cols * max_tile_rows * sizeof(tile_t));

    ps_pps->i1_pps_valid = 1;

    ps_codec->s_parse.ps_pps = ps_pps;
}